

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  uint uVar1;
  Message *pMVar2;
  undefined7 in_register_00000011;
  Int32 shard_index;
  Int32 total_shards;
  Message msg;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000011,in_subprocess_for_death_test) != 0) {
    return false;
  }
  uVar1 = Int32FromEnvOrDie(total_shards_env,-1);
  total_shards = uVar1;
  shard_index = Int32FromEnvOrDie(shard_index_env,-1);
  if ((uVar1 & shard_index) == 0xffffffff) {
    return false;
  }
  if (shard_index == 0xffffffff || uVar1 != 0xffffffff) {
    if (uVar1 == 0xffffffff || shard_index != 0xffffffff) {
      if ((-1 < shard_index) && (shard_index < (int)uVar1)) {
        return 1 < (int)uVar1;
      }
      Message::Message((Message *)&local_40);
      pMVar2 = Message::operator<<((Message *)&local_40,
                                   (char (*) [48])"Invalid environment variables: we require 0 <= ")
      ;
      pMVar2 = Message::operator<<(pMVar2,(char (*) [18])"GTEST_SHARD_INDEX");
      pMVar2 = Message::operator<<(pMVar2,(char (*) [4])" < ");
      pMVar2 = Message::operator<<(pMVar2,(char (*) [19])"GTEST_TOTAL_SHARDS");
      pMVar2 = Message::operator<<(pMVar2,(char (*) [16])", but you have ");
      pMVar2 = Message::operator<<(pMVar2,(char (*) [18])"GTEST_SHARD_INDEX");
      pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1d3970);
      pMVar2 = Message::operator<<(pMVar2,&shard_index);
      pMVar2 = Message::operator<<(pMVar2,(char (*) [3])0x1d6d17);
      pMVar2 = Message::operator<<(pMVar2,(char (*) [19])"GTEST_TOTAL_SHARDS");
      pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1d3970);
      pMVar2 = Message::operator<<(pMVar2,&total_shards);
      pMVar2 = Message::operator<<(pMVar2,(char (*) [3])0x1d538f);
      goto LAB_001523fc;
    }
    Message::Message((Message *)&local_40);
    pMVar2 = Message::operator<<((Message *)&local_40,
                                 (char (*) [41])"Invalid environment variables: you have ");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [19])"GTEST_TOTAL_SHARDS");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [4])0x1d5af2);
    pMVar2 = Message::operator<<(pMVar2,&total_shards);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [17])", but have left ");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [18])"GTEST_SHARD_INDEX");
  }
  else {
    Message::Message((Message *)&local_40);
    pMVar2 = Message::operator<<((Message *)&local_40,
                                 (char (*) [41])"Invalid environment variables: you have ");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [18])"GTEST_SHARD_INDEX");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [4])0x1d5af2);
    pMVar2 = Message::operator<<(pMVar2,&shard_index);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [17])", but have left ");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [19])"GTEST_TOTAL_SHARDS");
  }
  pMVar2 = Message::operator<<(pMVar2,(char (*) [9])" unset.\n");
LAB_001523fc:
  Message::Message(&msg,pMVar2);
  Message::~Message((Message *)&local_40);
  Message::GetString_abi_cxx11_(&local_40,&msg);
  ColoredPrintf(COLOR_RED,"%s",local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  fflush(_stdout);
  exit(1);
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, "%s", msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, "%s", msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, "%s", msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}